

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Remote.cpp
# Opt level: O0

bool __thiscall
XPMP2::RmtMsgBufTy<XPMP2::RemoteAcPosUpdateTy,_(XPMP2::RemoteMsgTy)4,_(unsigned_char)'\x00'>::
add_send(RmtMsgBufTy<XPMP2::RemoteAcPosUpdateTy,_(XPMP2::RemoteMsgTy)4,_(unsigned_char)__x00_> *this
        ,RemoteAcPosUpdateTy *_elem,UDPMulticast *_mc)

{
  bool bVar1;
  runtime_error *this_00;
  size_t in_RCX;
  int in_EDX;
  void *__buf;
  RmtMsgBufTy<XPMP2::RemoteAcPosUpdateTy,_(XPMP2::RemoteMsgTy)4,_(unsigned_char)__x00_> *in_RDI;
  int in_R8D;
  RemoteAcPosUpdateTy *in_stack_ffffffffffffffc0;
  bool local_1;
  
  bVar1 = add(in_RDI,in_stack_ffffffffffffffc0);
  if (bVar1) {
    local_1 = false;
  }
  else {
    send(in_RDI,in_EDX,__buf,in_RCX,in_R8D);
    bVar1 = add(in_RDI,in_stack_ffffffffffffffc0);
    if (!bVar1) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"Could not add new alement after sending/initializing a new message!");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool RmtMsgBufTy<ElemTy,MsgTy,msgVer>::add_send (const ElemTy& _elem,
                                                 UDPMulticast& _mc)
{
    if (!add(_elem)) {
        send(_mc);
        if (!add(_elem)) {
            throw std::runtime_error("Could not add new alement after sending/initializing a new message!");
        }
        return true;
    }
    return false;
}